

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
booster::locale::basic_format<wchar_t>::basic_format
          (basic_format<wchar_t> *this,string_type *format_string)

{
  formattible<wchar_t> *local_50;
  string_type *format_string_local;
  basic_format<wchar_t> *this_local;
  
  basic_message<wchar_t>::basic_message(&this->message_);
  std::__cxx11::wstring::wstring((wstring *)&this->format_,(wstring *)format_string);
  this->translate_ = false;
  local_50 = this->parameters_;
  do {
    details::formattible<wchar_t>::formattible(local_50);
    local_50 = local_50 + 1;
  } while (local_50 != (formattible<wchar_t> *)&this->parameters_count_);
  this->parameters_count_ = 0;
  std::
  vector<booster::locale::details::formattible<wchar_t>,_std::allocator<booster::locale::details::formattible<wchar_t>_>_>
  ::vector(&this->ext_params_);
  return;
}

Assistant:

basic_format(string_type format_string) : 
                format_(format_string),
                translate_(false),
                parameters_count_(0)
            {
            }